

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::Usd_IntegerCompression64::CompressToBuffer
                 (int64_t *ints,size_t numInts,char *compressed,string *err)

{
  size_t sVar1;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> _Var2;
  mapped_type *pmVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  byte *pbVar14;
  bool bVar15;
  long lStack_a0;
  long local_78;
  unique_ptr<char[],_std::default_delete<char[]>_> encodeBuffer;
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  counts;
  
  sVar1 = anon_unknown_0::_GetEncodedBufferSize<long>(numInts);
  _Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(sVar1);
  encodeBuffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 _Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (numInts == 0) {
    sVar1 = 0;
  }
  else {
    counts._M_h._M_buckets = &counts._M_h._M_single_bucket;
    counts._M_h._M_bucket_count = 1;
    counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    counts._M_h._M_element_count = 0;
    counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    counts._M_h._M_rehash_policy._M_next_resize = 0;
    counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
    lVar10 = 0;
    uVar8 = 0;
    lVar11 = 0;
    for (lVar9 = 0; numInts * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
      local_78 = *(long *)((long)ints + lVar9) - lVar10;
      pmVar3 = ::std::__detail::
               _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&counts,&local_78);
      uVar6 = *pmVar3 + 1;
      *pmVar3 = uVar6;
      bVar15 = uVar6 == uVar8;
      lVar12 = local_78;
      if (((uVar6 <= uVar8) && (uVar6 = uVar8, lVar12 = lVar11, bVar15)) && (lVar11 < local_78)) {
        lVar12 = local_78;
      }
      lVar10 = *(long *)((long)ints + lVar9);
      uVar8 = uVar6;
      lVar11 = lVar12;
    }
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&counts._M_h);
    *(long *)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl = lVar11;
    pbVar14 = (byte *)((long)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl + 8);
    plVar7 = (long *)((numInts * 2 + 7 >> 3) +
                      (long)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                            super__Head_base<0UL,_char_*,_false>._M_head_impl + 8);
    lVar10 = 0;
LAB_0026a867:
    switch(numInts) {
    case 0:
LAB_0026aac6:
      sVar1 = (long)plVar7 -
              (long)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl;
      break;
    case 1:
      lVar10 = *ints - lVar10;
      if (lVar10 == lVar11) {
        bVar13 = 0;
      }
      else if ((short)lVar10 == lVar10) {
        *(short *)plVar7 = (short)lVar10;
        plVar7 = (long *)((long)plVar7 + 2);
        bVar13 = 1;
      }
      else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
        *plVar7 = lVar10;
        plVar7 = plVar7 + 1;
        bVar13 = 3;
      }
      else {
        *(int *)plVar7 = (int)lVar10;
        plVar7 = (long *)((long)plVar7 + 4);
        bVar13 = 2;
      }
      goto LAB_0026aac3;
    case 2:
      lVar9 = *ints;
      lVar10 = lVar9 - lVar10;
      if (lVar10 == lVar11) {
        bVar13 = 0;
      }
      else if ((short)lVar10 == lVar10) {
        *(short *)plVar7 = (short)lVar10;
        plVar7 = (long *)((long)plVar7 + 2);
        bVar13 = 1;
      }
      else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
        *plVar7 = lVar10;
        plVar7 = plVar7 + 1;
        bVar13 = 3;
      }
      else {
        *(int *)plVar7 = (int)lVar10;
        plVar7 = (long *)((long)plVar7 + 4);
        bVar13 = 2;
      }
      lVar9 = ints[1] - lVar9;
      if (lVar9 != lVar11) {
        if ((short)lVar9 == lVar9) {
          *(short *)plVar7 = (short)lVar9;
          bVar4 = 4;
          lStack_a0 = 2;
        }
        else if (lVar9 - 0x80000000U < 0xffffffff00000000) {
          *plVar7 = lVar9;
          bVar4 = 0xc;
          lStack_a0 = 8;
        }
        else {
          *(int *)plVar7 = (int)lVar9;
          bVar4 = 8;
          lStack_a0 = 4;
        }
        plVar7 = (long *)((long)plVar7 + lStack_a0);
        bVar13 = bVar13 | bVar4;
      }
      goto LAB_0026aac3;
    case 3:
      bVar13 = 0;
      for (lVar9 = 0; (int)lVar9 != 6; lVar9 = lVar9 + 2) {
        lVar12 = *(long *)((long)ints + lVar9 * 4);
        lVar10 = lVar12 - lVar10;
        if (lVar10 != lVar11) {
          bVar4 = (byte)lVar9;
          if ((short)lVar10 == lVar10) {
            bVar4 = (byte)(1 << (bVar4 & 0x1f));
            *(short *)plVar7 = (short)lVar10;
            lVar10 = 2;
          }
          else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
            bVar4 = (byte)(3 << (bVar4 & 0x1f));
            *plVar7 = lVar10;
            lVar10 = 8;
          }
          else {
            bVar4 = (byte)(2 << (bVar4 & 0x1f));
            *(int *)plVar7 = (int)lVar10;
            lVar10 = 4;
          }
          plVar7 = (long *)((long)plVar7 + lVar10);
          bVar13 = bVar13 | bVar4;
        }
        lVar10 = lVar12;
      }
LAB_0026aac3:
      *pbVar14 = bVar13;
      goto LAB_0026aac6;
    default:
      goto switchD_0026a8f9_default;
    }
  }
  sVar1 = LZ4Compression::CompressToBuffer
                    ((char *)encodeBuffer._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,compressed,sVar1,err)
  ;
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&encodeBuffer);
  return sVar1;
switchD_0026a8f9_default:
  bVar13 = 0;
  for (iVar5 = 0; iVar5 != 8; iVar5 = iVar5 + 2) {
    lVar9 = *ints;
    lVar10 = lVar9 - lVar10;
    if (lVar10 != lVar11) {
      bVar4 = (byte)iVar5;
      if ((short)lVar10 == lVar10) {
        bVar4 = (byte)(1 << (bVar4 & 0x1f));
        *(short *)plVar7 = (short)lVar10;
        lVar10 = 2;
      }
      else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
        bVar4 = (byte)(3 << (bVar4 & 0x1f));
        *plVar7 = lVar10;
        lVar10 = 8;
      }
      else {
        bVar4 = (byte)(2 << (bVar4 & 0x1f));
        *(int *)plVar7 = (int)lVar10;
        lVar10 = 4;
      }
      plVar7 = (long *)((long)plVar7 + lVar10);
      bVar13 = bVar13 | bVar4;
    }
    ints = ints + 1;
    lVar10 = lVar9;
  }
  *pbVar14 = bVar13;
  pbVar14 = pbVar14 + 1;
  numInts = numInts - 4;
  goto LAB_0026a867;
}

Assistant:

size_t
Usd_IntegerCompression64::CompressToBuffer(
    int64_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}